

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O1

void __thiscall chrono::ChMatterSPH::VariablesFbLoadForces(ChMatterSPH *this,double factor)

{
  undefined1 auVar1 [16];
  ChSystem *pCVar2;
  pointer psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar5;
  bool bVar6;
  undefined8 uVar7;
  double dVar8;
  Index size;
  ChProximityContainerSPH *this_01;
  pointer psVar9;
  long lVar10;
  ulong uVar11;
  Index index;
  ulong uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  uint uVar14;
  Index index_1;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  pointer psVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  undefined1 auVar19 [64];
  double dVar20;
  ChVector<double> TotForce;
  double local_c8 [4];
  double local_a8;
  ChVectorRef local_90;
  undefined1 local_78 [64];
  
  pCVar2 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
  psVar18 = (pCVar2->assembly).otherphysicslist.
            super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (pCVar2->assembly).otherphysicslist.
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78._0_8_ = psVar3;
  local_a8 = factor;
  if (psVar18 == psVar3) {
    this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (ChProximityContainerSPH *)0x0;
  }
  else {
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      peVar4 = (psVar18->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = (psVar18->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (peVar4 == (element_type *)0x0) {
        this_01 = (ChProximityContainerSPH *)0x0;
      }
      else {
        this_01 = (ChProximityContainerSPH *)
                  __dynamic_cast(peVar4,&ChPhysicsItem::typeinfo,&ChProximityContainerSPH::typeinfo,
                                 0);
      }
      this_02 = this_00;
      if (this_01 == (ChProximityContainerSPH *)0x0) {
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (this_01 != (ChProximityContainerSPH *)0x0 &&
          this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
          this_02 = this_00;
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
          this_02 = this_00;
        }
      }
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (this_01 != (ChProximityContainerSPH *)0x0) break;
      psVar18 = psVar18 + 1;
      p_Var13 = this_02;
    } while (psVar18 != (pointer)local_78._0_8_);
  }
  dVar8 = DAT_00b90ac8;
  dVar20 = DAT_00b90ac0;
  uVar7 = VNULL;
  if (this_01 == (ChProximityContainerSPH *)0x0) {
    __assert_fail("edges",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                  ,0x1e5,"virtual void chrono::ChMatterSPH::VariablesFbLoadForces(double)");
  }
  psVar9 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9;
  if (lVar10 != 0) {
    uVar14 = 1;
    do {
      peVar5 = (psVar9->super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar5 != (element_type *)Q_ROTATE_X_TO_Z) {
        (peVar5->UserForce).m_data[0] = (double)uVar7;
        *(double *)((long)&peVar5->UserForce + 8) = dVar20;
        *(double *)((long)&peVar5->UserForce + 0x10) = dVar8;
      }
      peVar5->density = 0.0;
      uVar11 = (ulong)uVar14;
      psVar9 = psVar9 + 1;
      uVar14 = uVar14 + 1;
    } while (uVar11 < (ulong)(lVar10 >> 4));
  }
  ChProximityContainerSPH::AccumulateStep1(this_01);
  psVar9 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar9) {
    uVar11 = 0;
    uVar12 = 1;
    do {
      peVar5 = psVar9[uVar11].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var13 = psVar9[uVar11].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        }
      }
      if (peVar5 == (element_type *)0x0) {
        __assert_fail("mnode",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                      ,0x1f8,"virtual void chrono::ChMatterSPH::VariablesFbLoadForces(double)");
      }
      dVar20 = 0.0;
      if ((peVar5->density != 0.0) || (NAN(peVar5->density))) {
        dVar20 = (double)(**(code **)((long)(peVar5->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))
                                   (peVar5);
        dVar20 = dVar20 / peVar5->density;
      }
      peVar5->volume = dVar20;
      peVar5->pressure =
           (peVar5->density - (this->material).super_ChContinuumMaterial.density) *
           (this->material).pressure_stiffness;
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
      }
      psVar9 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar12 < (ulong)((long)(this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4)
      ;
      uVar11 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar6);
  }
  ChProximityContainerSPH::AccumulateStep2(this_01);
  psVar9 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar9) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_a8;
    local_78 = vbroadcastsd_avx512f(auVar1);
    uVar11 = 0;
    do {
      pCVar2 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
      dVar20 = (double)(**(code **)((long)((psVar9[uVar11].
                                            super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))()
      ;
      psVar9 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar5 = psVar9[uVar11].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_c8[0] = dVar20 * (pCVar2->G_acc).m_data[0] + (peVar5->UserForce).m_data[0];
      local_c8[1] = dVar20 * (pCVar2->G_acc).m_data[1] + *(double *)((long)&peVar5->UserForce + 8);
      local_c8[2] = dVar20 * (pCVar2->G_acc).m_data[2] +
                    *(double *)((long)&peVar5->UserForce + 0x10);
      p_Var13 = psVar9[uVar11].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        }
      }
      if (peVar5 == (element_type *)0x0) {
        __assert_fail("mnode",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                      ,0x214,"virtual void chrono::ChMatterSPH::VariablesFbLoadForces(double)");
      }
      ChVariables::Get_fb(&local_90,&(peVar5->variables).super_ChVariables);
      if (local_90.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._8_8_ != 3) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 3, 1>>, const Eigen::Map<Eigen::Matrix<double, 3, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      uVar12 = 3;
      if (((local_90.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ & 7) == 0) &&
         (uVar12 = (ulong)(-((uint)((ulong)local_90.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ >> 3) & 0x1fffffff) & 7), 2 < uVar12)) {
        uVar12 = 3;
      }
      uVar16 = -uVar12 + 3;
      uVar15 = -uVar12 + 10;
      if (-1 < (long)uVar16) {
        uVar15 = uVar16;
      }
      if (uVar12 != 0) {
        uVar17 = 0;
        do {
          *(double *)
           (local_90.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar17 * 8) =
               local_a8 * local_c8[uVar17] +
               *(double *)
                (local_90.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + uVar17 * 8);
          uVar17 = uVar17 + 1;
        } while (uVar12 != uVar17);
      }
      lVar10 = (uVar15 & 0xfffffffffffffff8) + uVar12;
      if (7 < (long)uVar16) {
        do {
          auVar19 = vmulpd_avx512f(local_78,*(undefined1 (*) [64])(local_c8 + uVar12));
          auVar19 = vaddpd_avx512f(auVar19,*(undefined1 (*) [64])
                                            (local_90.
                                             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                             ._0_8_ + uVar12 * 8));
          *(undefined1 (*) [64])
           (local_90.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar12 * 8) = auVar19;
          uVar12 = uVar12 + 8;
        } while ((long)uVar12 < lVar10);
      }
      if (lVar10 < 3) {
        do {
          *(double *)
           (local_90.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + lVar10 * 8) =
               local_a8 * local_c8[lVar10] +
               *(double *)
                (local_90.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + lVar10 * 8);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
      }
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      psVar9 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(this->nodes).
                                    super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4))
    ;
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  return;
}

Assistant:

void ChMatterSPH::VariablesFbLoadForces(double factor) {
    // COMPUTE THE SPH FORCES HERE

    // First, find if any ChProximityContainerSPH object is present in the system

    std::shared_ptr<ChProximityContainerSPH> edges;
    for (auto otherphysics : GetSystem()->Get_otherphysicslist()) {
        if ((edges = std::dynamic_pointer_cast<ChProximityContainerSPH>(otherphysics)))
            break;
    }
    assert(edges);  // If using a ChMatterSPH, you must add also a ChProximityContainerSPH.
    if (!edges)
        return;

    // 1- Per-node initialization

    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->UserForce = VNULL;
        nodes[j]->density = 0;
    }

    // 2- Per-edge initialization and accumulation of particles's density

    edges->AccumulateStep1();

    // 3- Per-node volume and pressure computation

    for (unsigned int j = 0; j < nodes.size(); j++) {
        std::shared_ptr<ChNodeSPH> mnode(nodes[j]);
        assert(mnode);

        // node volume is v=mass/density
        if (mnode->density)
            mnode->volume = mnode->GetMass() / mnode->density;
        else
            mnode->volume = 0;

        // node pressure = k(dens - dens_0);
        mnode->pressure = material.Get_pressure_stiffness() * (mnode->density - material.Get_density());
    }

    // 4- Per-edge forces computation and accumulation

    edges->AccumulateStep2();

    // 5- Per-node load forces

    for (unsigned int j = 0; j < nodes.size(); j++) {
        // particle gyroscopic force:
        // none.

        // add gravity
        ChVector<> Gforce = GetSystem()->Get_G_acc() * nodes[j]->GetMass();
        ChVector<> TotForce = nodes[j]->UserForce + Gforce;

        // downcast
        std::shared_ptr<ChNodeSPH> mnode(nodes[j]);
        assert(mnode);

        mnode->variables.Get_fb() += factor * TotForce.eigen();
    }
}